

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_atomic(CompilerHLSL *this,uint32_t *ops,uint32_t length,Op op)

{
  uint id;
  uint32_t uVar1;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  SPIRAccessChain *pSVar4;
  mapped_type *pmVar5;
  CompilerError *pCVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ulong uVar7;
  BaseType expr_type;
  char *atomic_op;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string value_expr;
  uint32_t result_type;
  
  atomic_op = (char *)0x0;
  value_expr._M_dataplus._M_p = (pointer)&value_expr.field_2;
  value_expr._M_string_length = 0;
  value_expr.field_2._M_local_buf[0] = '\0';
  uVar7 = (ulong)(op - OpAtomicLoad);
  switch(uVar7) {
  case 0:
switchD_0026304b_caseD_0:
    break;
  case 1:
switchD_0026304b_caseD_1:
    atomic_op = "InterlockedExchange";
    pSVar2 = Compiler::expression_type((Compiler *)this,*ops);
    pSVar4 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,*ops);
    pmVar5 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).extra_sub_expressions,ops);
    if (*pmVar5 == 0) {
      uVar1 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *pmVar5 = uVar1;
      pSVar3 = Compiler::get_pointee_type((Compiler *)this,pSVar2);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,(pSVar3->super_IVariant).self.id,*pmVar5);
    }
    if ((pSVar4 == (SPIRAccessChain *)0x0) || (pSVar2->storage == StorageClassImage)) {
      CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,*ops,true);
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)&result_type,&this->super_CompilerGLSL,*pmVar5,true);
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&atomic_op,(char (*) [2])0x31efa1,&expr,
                 (char (*) [3])0x31b6f8,&local_90,(char (*) [3])0x31b6f8,(string *)&result_type,
                 (char (*) [3])0x304bad);
      ::std::__cxx11::string::~string((string *)&result_type);
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,*pmVar5,true);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&pSVar4->base,(char (*) [2])0x30abe2,&atomic_op,
                 (char (*) [2])0x31efa1,&pSVar4->dynamic_index,&pSVar4->static_index,
                 (char (*) [3])0x31b6f8,&expr,(char (*) [3])0x31b6f8,&local_90,
                 (char (*) [3])0x304bad);
    }
    ::std::__cxx11::string::~string((string *)&local_90);
    goto LAB_0026344f;
  default:
    CompilerGLSL::to_expression_abi_cxx11_
              (&expr,&this->super_CompilerGLSL,ops[(ulong)(op == OpAtomicCompareExchange) + 5],true)
    ;
    ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
    ::std::__cxx11::string::~string((string *)&expr);
    if (0xf < op - OpAtomicLoad) {
switchD_002632ca_caseD_4:
      pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&expr,"Unknown atomic opcode.",(allocator *)&local_90);
      CompilerError::CompilerError(pCVar6,&expr);
      __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&switchD_002632ca::switchdataD_0030bcf8 +
           (long)(int)(&switchD_002632ca::switchdataD_0030bcf8)[uVar7]);
    switch(uVar7) {
    case 0:
      goto switchD_0026304b_caseD_0;
    case 1:
      goto switchD_0026304b_caseD_1;
    case 2:
      atomic_op = "InterlockedExchange";
      break;
    case 3:
      if (length < 8) {
        pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&expr,"Not enough data for opcode.",(allocator *)&local_90);
        CompilerError::CompilerError(pCVar6,&expr);
        __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      atomic_op = "InterlockedCompareExchange";
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,ops[7],true);
      join<std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                (&expr,(spirv_cross *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31b6f8,
                 (char (*) [3])&value_expr,in_R8);
      goto LAB_0026352e;
    default:
      goto switchD_002632ca_caseD_4;
    case 7:
      atomic_op = "InterlockedAdd";
      break;
    case 8:
      atomic_op = "InterlockedAdd";
      CompilerGLSL::enclose_expression(&local_90,&this->super_CompilerGLSL,&value_expr);
      join<char_const(&)[2],std::__cxx11::string>
                (&expr,(spirv_cross *)0x309fb1,(char (*) [2])&local_90,ts_1);
LAB_0026352e:
      ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
      ::std::__cxx11::string::~string((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_90);
      break;
    case 9:
    case 10:
      atomic_op = "InterlockedMin";
      break;
    case 0xb:
    case 0xc:
      atomic_op = "InterlockedMax";
      break;
    case 0xd:
      atomic_op = "InterlockedAnd";
      break;
    case 0xe:
      atomic_op = "InterlockedOr";
      break;
    case 0xf:
      atomic_op = "InterlockedXor";
    }
    goto LAB_00263083;
  case 5:
    break;
  case 6:
  }
  atomic_op = "InterlockedAdd";
  ::std::__cxx11::string::assign((char *)&value_expr);
LAB_00263083:
  uVar1 = *ops;
  id = ops[1];
  result_type = uVar1;
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,ops + 1);
  pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])(&expr,this,pSVar2,&local_90,0);
  CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,&expr,(char (*) [2])0x304bae);
  ::std::__cxx11::string::~string((string *)&expr);
  ::std::__cxx11::string::~string((string *)&local_90);
  pSVar3 = Compiler::expression_type((Compiler *)this,ops[2]);
  pSVar4 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,ops[2]);
  if ((pSVar4 == (SPIRAccessChain *)0x0) || (pSVar3->storage == StorageClassImage)) {
    CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,ops[2],true);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
    CompilerGLSL::
    statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,&atomic_op,(char (*) [2])0x31efa1,&expr,
               (char (*) [3])0x31b6f8,&value_expr,(char (*) [3])0x31b6f8,&local_90,
               (char (*) [3])0x304bad);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&expr);
    expr_type = *(BaseType *)&(pSVar3->super_IVariant).field_0xc;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&expr,this,(ulong)id,1);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,&pSVar4->base,(char (*) [2])0x30abe2,&atomic_op,
               (char (*) [2])0x31efa1,&pSVar4->dynamic_index,&pSVar4->static_index,
               (char (*) [3])0x31b6f8,&value_expr,(char (*) [3])0x31b6f8,&expr,
               (char (*) [3])0x304bad);
    ::std::__cxx11::string::~string((string *)&expr);
    expr_type = UInt;
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
  CompilerGLSL::bitcast_expression(&expr,&this->super_CompilerGLSL,pSVar2,expr_type,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  local_90._M_dataplus._M_p._0_1_ = 1;
  Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
            ((Compiler *)this,id,&expr,&result_type,(bool *)&local_90);
LAB_0026344f:
  ::std::__cxx11::string::~string((string *)&expr);
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  ::std::__cxx11::string::~string((string *)&value_expr);
  return;
}

Assistant:

void CompilerHLSL::emit_atomic(const uint32_t *ops, uint32_t length, spv::Op op)
{
	const char *atomic_op = nullptr;

	string value_expr;
	if (op != OpAtomicIDecrement && op != OpAtomicIIncrement && op != OpAtomicLoad && op != OpAtomicStore)
		value_expr = to_expression(ops[op == OpAtomicCompareExchange ? 6 : 5]);

	bool is_atomic_store = false;

	switch (op)
	{
	case OpAtomicIIncrement:
		atomic_op = "InterlockedAdd";
		value_expr = "1";
		break;

	case OpAtomicIDecrement:
		atomic_op = "InterlockedAdd";
		value_expr = "-1";
		break;

	case OpAtomicLoad:
		atomic_op = "InterlockedAdd";
		value_expr = "0";
		break;

	case OpAtomicISub:
		atomic_op = "InterlockedAdd";
		value_expr = join("-", enclose_expression(value_expr));
		break;

	case OpAtomicSMin:
	case OpAtomicUMin:
		atomic_op = "InterlockedMin";
		break;

	case OpAtomicSMax:
	case OpAtomicUMax:
		atomic_op = "InterlockedMax";
		break;

	case OpAtomicAnd:
		atomic_op = "InterlockedAnd";
		break;

	case OpAtomicOr:
		atomic_op = "InterlockedOr";
		break;

	case OpAtomicXor:
		atomic_op = "InterlockedXor";
		break;

	case OpAtomicIAdd:
		atomic_op = "InterlockedAdd";
		break;

	case OpAtomicExchange:
		atomic_op = "InterlockedExchange";
		break;

	case OpAtomicStore:
		atomic_op = "InterlockedExchange";
		is_atomic_store = true;
		break;

	case OpAtomicCompareExchange:
		if (length < 8)
			SPIRV_CROSS_THROW("Not enough data for opcode.");
		atomic_op = "InterlockedCompareExchange";
		value_expr = join(to_expression(ops[7]), ", ", value_expr);
		break;

	default:
		SPIRV_CROSS_THROW("Unknown atomic opcode.");
	}

	if (is_atomic_store)
	{
		auto &data_type = expression_type(ops[0]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[0]);

		auto &tmp_id = extra_sub_expressions[ops[0]];
		if (!tmp_id)
		{
			tmp_id = ir.increase_bound_by(1);
			emit_uninitialized_temporary_expression(get_pointee_type(data_type).self, tmp_id);
		}

		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_expression(ops[0]), ", ", to_expression(ops[3]), ", ", to_expression(tmp_id),
			          ");");
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			statement(chain->base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
	}
	else
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		forced_temporaries.insert(ops[1]);

		auto &type = get<SPIRType>(result_type);
		statement(variable_decl(type, to_name(id)), ";");

		auto &data_type = expression_type(ops[2]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
		SPIRType::BaseType expr_type;
		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_expression(ops[2]), ", ", value_expr, ", ", to_name(id), ");");
			expr_type = data_type.basetype;
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			expr_type = SPIRType::UInt;
			statement(chain->base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ", value_expr,
			          ", ", to_name(id), ");");
		}

		auto expr = bitcast_expression(type, expr_type, to_name(id));
		set<SPIRExpression>(id, expr, result_type, true);
	}
	flush_all_atomic_capable_variables();
}